

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall choc::html::HTMLElement::addParagraph(HTMLElement *this)

{
  HTMLElement *pHVar1;
  allocator<char> local_31;
  string local_30;
  HTMLElement *local_10;
  HTMLElement *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"p",&local_31);
  pHVar1 = addChild(this,&local_30);
  pHVar1 = setInline(pHVar1,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pHVar1;
}

Assistant:

HTMLElement& addParagraph()                         { return addChild ("p").setInline (true); }